

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.h
# Opt level: O2

void StrToInts(int *pInts,int Num,char *pStr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  char aBuf [4];
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  do {
    bVar4 = Num == 0;
    Num = Num + -1;
    if (bVar4) {
      *(undefined1 *)((uint *)pInts + -1) = 0;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
      __stack_chk_fail();
    }
    local_c = 0;
    iVar1 = iVar2 + 4;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      if (pStr[lVar3 + iVar2] == '\0') {
        iVar1 = iVar2 + (int)lVar3;
        break;
      }
      *(char *)((long)&local_c + lVar3) = pStr[lVar3 + iVar2];
    }
    *pInts = (int)local_c._3_1_ + 0x80U | local_c._2_1_ * 0x100 + 0x8000U |
             local_c._1_1_ * 0x10000 + 0x800000U | (local_c ^ 0xffffff80) << 0x18;
    pInts = (int *)((uint *)pInts + 1);
    iVar2 = iVar1;
  } while( true );
}

Assistant:

inline void StrToInts(int *pInts, int Num, const char *pStr)
{
	int Index = 0;
	while(Num)
	{
		char aBuf[4] = {0,0,0,0};
		for(int c = 0; c < 4 && pStr[Index]; c++, Index++)
			aBuf[c] = pStr[Index];
		*pInts = ((aBuf[0]+128)<<24)|((aBuf[1]+128)<<16)|((aBuf[2]+128)<<8)|(aBuf[3]+128);
		pInts++;
		Num--;
	}

	// null terminate
	pInts[-1] &= 0xffffff00;
}